

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall
CVmImageLoader::read_data(CVmImageLoader *this,char *buf,size_t read_len,ulong *remaining_size)

{
  ulong *in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  if (*in_RCX < in_RDX) {
    err_throw(0);
  }
  *in_RCX = *in_RCX - in_RDX;
  (**(code **)(*(long *)*in_RDI + 0x18))((long *)*in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

void CVmImageLoader::read_data(char *buf, size_t read_len,
                               ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* read the data */
    fp_->copy_data(buf, read_len);
}